

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDistanceCalculator.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
findAllTags(vector<int,_std::allocator<int>_> *__return_storage_ptr__,ImportedUgrid *mesh)

{
  bool bVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  reference piVar3;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar4;
  allocator<int> local_c9;
  _Rb_tree_const_iterator<int> local_c8;
  _Rb_tree_const_iterator<int> local_c0;
  _Base_ptr local_b8;
  undefined1 local_b0;
  int local_a4;
  const_iterator cStack_a0;
  int t_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  int local_64;
  const_iterator cStack_60;
  int t;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  set<int,_std::less<int>,_std::allocator<int>_> tags;
  ImportedUgrid *mesh_local;
  
  tags._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)mesh;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
  pvVar2 = (vector<int,_std::allocator<int>_> *)
           (tags._M_t._M_impl.super__Rb_tree_header._M_node_count + 0xd8);
  __end1 = std::vector<int,_std::allocator<int>_>::begin(pvVar2);
  cStack_60 = std::vector<int,_std::allocator<int>_>::end(pvVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffa0);
    if (!bVar1) break;
    piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end1);
    local_64 = *piVar3;
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1,&local_64);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  pvVar2 = (vector<int,_std::allocator<int>_> *)
           (tags._M_t._M_impl.super__Rb_tree_header._M_node_count + 0xf0);
  __end1_1 = std::vector<int,_std::allocator<int>_>::begin(pvVar2);
  cStack_a0 = std::vector<int,_std::allocator<int>_>::end(pvVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1_1,&stack0xffffffffffffff60);
    if (!bVar1) break;
    piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end1_1);
    local_a4 = *piVar3;
    pVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1,&local_a4);
    local_b8 = (_Base_ptr)pVar4.first._M_node;
    local_b0 = pVar4.second;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1_1);
  }
  local_c0._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
  local_c8._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::end
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
  std::allocator<int>::allocator(&local_c9);
  std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
            ((vector<int,std::allocator<int>> *)__return_storage_ptr__,local_c0,local_c8,&local_c9);
  std::allocator<int>::~allocator(&local_c9);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> findAllTags(const Parfait::ImportedUgrid& mesh){
    std::set<int> tags;
    for(auto t : mesh.triangleTags)
        tags.insert(t);
    for(auto t : mesh.quadTags)
        tags.insert(t);
    return {tags.begin(), tags.end()};
}